

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O2

int acutest_cmdline_callback_(int id,char *arg)

{
  byte bVar1;
  acutest_test_data_ *paVar2;
  FILE *__stream;
  ulong uVar3;
  int iVar4;
  int *piVar5;
  size_t sVar6;
  char *pcVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  char *pcVar13;
  bool bVar14;
  bool bVar15;
  
  bVar1 = acutest_list_size_;
  switch(id) {
  case 99:
    if ((arg == (char *)0x0) || (iVar4 = strcmp(arg,"always"), iVar4 == 0)) {
      acutest_colorize_ = 1;
      return 0;
    }
    iVar4 = strcmp(arg,"never");
    if (iVar4 == 0) {
      acutest_colorize_ = 0;
      return 0;
    }
    iVar4 = strcmp(arg,"auto");
    if (iVar4 == 0) {
      return 0;
    }
    pcVar13 = "%s: Unrecognized argument \'%s\' for option --color.\n";
    goto LAB_00103ba1;
  case 100:
  case 0x66:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x72:
  case 0x73:
  case 0x75:
    break;
  case 0x65:
    if ((arg == (char *)0x0) || (iVar4 = strcmp(arg,"always"), iVar4 == 0)) {
      acutest_no_exec_ = 0;
      return 0;
    }
    iVar4 = strcmp(arg,"never");
    if (iVar4 == 0) {
      acutest_no_exec_ = 1;
      return 0;
    }
    iVar4 = strcmp(arg,"auto");
    if (iVar4 == 0) {
      return 0;
    }
    pcVar13 = "%s: Unrecognized argument \'%s\' for option --exec.\n";
    goto LAB_00103ba1;
  case 0x68:
    acutest_help_();
    goto LAB_00103b52;
  case 0x6c:
    acutest_list_names_();
LAB_00103b52:
    acutest_exit_(0);
  case 0x71:
    acutest_verbose_level_ = 0;
    break;
  case 0x74:
    if ((arg == (char *)0x0) || (iVar4 = strcmp(arg,"real"), iVar4 == 0)) {
      acutest_timer_ = 1;
      return 0;
    }
    iVar4 = strcmp(arg,"cpu");
    if (iVar4 == 0) {
      acutest_timer_ = 2;
      return 0;
    }
    pcVar13 = "%s: Unrecognized argument \'%s\' for option --time.\n";
LAB_00103ba1:
    fprintf(_stderr,pcVar13,acutest_argv0_,arg);
LAB_00103bab:
    pcVar13 = "Try \'%s --help\' for more information.\n";
LAB_00103bbc:
    fprintf(_stderr,pcVar13,acutest_argv0_);
LAB_00103bc3:
    acutest_exit_(2);
  case 0x76:
    if (arg == (char *)0x0) {
      acutest_verbose_level_ = acutest_verbose_level_ + 1;
    }
    else {
      acutest_verbose_level_ = atoi(arg);
    }
    break;
  case 0x77:
    acutest_worker_ = 1;
    acutest_worker_index_ = atoi(arg);
    break;
  case 0x78:
    acutest_xml_output_ = (FILE *)fopen(arg,"w");
    __stream = _stderr;
    if ((FILE *)acutest_xml_output_ != (FILE *)0x0) {
      return 0;
    }
    piVar5 = __errno_location();
    pcVar13 = strerror(*piVar5);
    fprintf(__stream,"Unable to open \'%s\': %s\n",arg,pcVar13);
    goto LAB_00103bc3;
  default:
    if (id != 0) {
      if (id == 0x43) {
        acutest_colorize_ = 0;
        return 0;
      }
      if (id == 0x45) {
        acutest_no_exec_ = 1;
        return 0;
      }
      if (id == 0x53) {
        acutest_no_summary_ = 1;
        return 0;
      }
      if (id == 0x54) {
        acutest_tap_ = 1;
        return 0;
      }
      if (id == 0x58) {
        acutest_exclude_mode_ = 1;
        return 0;
      }
      if (id == -0x7fffffff) {
        pcVar13 = "Unrecognized command line option \'%s\'.\n";
      }
      else if (id == -0x7ffffffe) {
        pcVar13 = "The command line option \'%s\' requires an argument.\n";
      }
      else {
        if (id != -0x7ffffffd) {
          return 0;
        }
        pcVar13 = "The command line option \'%s\' does not expect an argument.\n";
      }
      fprintf(_stderr,pcVar13,arg);
      goto LAB_00103bab;
    }
    uVar11 = (uint)acutest_list_size_;
    uVar10 = (ulong)acutest_list_size_;
    uVar3 = 0;
    while (uVar9 = uVar3, paVar2 = acutest_test_data_, (uVar10 << 5 | 0x10) != uVar9 + 0x10) {
      iVar4 = strcmp(*(char **)((long)&acutest_list_[0].name + uVar9),arg);
      uVar3 = uVar9 + 0x10;
      if (iVar4 == 0) {
        *(undefined4 *)((long)&acutest_test_data_->state + uVar9) = 0xfffffffd;
        return 0;
      }
    }
    iVar4 = 0;
    for (uVar10 = 0; uVar10 != uVar11 * 2; uVar10 = uVar10 + 1) {
      pcVar13 = acutest_list_[uVar10].name;
      sVar6 = strlen(arg);
      pcVar7 = pcVar13;
      do {
        pcVar7 = strstr(pcVar7,arg);
        if (pcVar7 == (char *)0x0) goto LAB_00103a98;
        bVar15 = true;
        bVar14 = true;
        if (pcVar7 != pcVar13) {
          pvVar8 = memchr(acutest_name_contains_word__word_delim,(int)pcVar7[-1],10);
          bVar14 = pvVar8 != (void *)0x0;
        }
        if (pcVar7[sVar6] != '\0') {
          pvVar8 = memchr(acutest_name_contains_word__word_delim,(int)pcVar7[sVar6],10);
          bVar15 = pvVar8 != (void *)0x0;
        }
        pcVar7 = pcVar7 + 1;
      } while (!(bool)(bVar14 & bVar15));
      paVar2[uVar10].state = ACUTEST_STATE_SELECTED;
      iVar4 = iVar4 + 1;
LAB_00103a98:
    }
    if (0 < iVar4) {
      return 0;
    }
    for (lVar12 = 0; (ulong)bVar1 << 5 != lVar12; lVar12 = lVar12 + 0x10) {
      pcVar13 = strstr(*(char **)((long)&acutest_list_[0].name + lVar12),arg);
      if (pcVar13 != (char *)0x0) {
        *(undefined4 *)((long)&paVar2->state + lVar12) = 0xfffffffd;
        iVar4 = iVar4 + 1;
      }
    }
    if (iVar4 != 0) {
      return 0;
    }
    fprintf(_stderr,"%s: Unrecognized unit test \'%s\'\n",acutest_argv0_,arg);
    pcVar13 = "Try \'%s --list\' for list of unit tests.\n";
    goto LAB_00103bbc;
  }
  return 0;
}

Assistant:

static int
acutest_cmdline_callback_(int id, const char* arg)
{
    switch(id) {
        case 'X':
            acutest_exclude_mode_ = 1;
            break;

        case 'e':
            if(arg == NULL || strcmp(arg, "always") == 0) {
                acutest_no_exec_ = 0;
            } else if(strcmp(arg, "never") == 0) {
                acutest_no_exec_ = 1;
            } else if(strcmp(arg, "auto") == 0) {
                /*noop*/
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --exec.\n", acutest_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
                acutest_exit_(2);
            }
            break;

        case 'E':
            acutest_no_exec_ = 1;
            break;

        case 't':
#if defined ACUTEST_WIN_  ||  defined ACUTEST_HAS_POSIX_TIMER_
            if(arg == NULL || strcmp(arg, "real") == 0) {
                acutest_timer_ = 1;
    #ifndef ACUTEST_WIN_
            } else if(strcmp(arg, "cpu") == 0) {
                acutest_timer_ = 2;
    #endif
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --time.\n", acutest_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
                acutest_exit_(2);
            }
#endif
            break;

        case 'S':
            acutest_no_summary_ = 1;
            break;

        case 'T':
            acutest_tap_ = 1;
            break;

        case 'l':
            acutest_list_names_();
            acutest_exit_(0);
            break;

        case 'v':
            acutest_verbose_level_ = (arg != NULL ? atoi(arg) : acutest_verbose_level_+1);
            break;

        case 'q':
            acutest_verbose_level_ = 0;
            break;

        case 'c':
            if(arg == NULL || strcmp(arg, "always") == 0) {
                acutest_colorize_ = 1;
            } else if(strcmp(arg, "never") == 0) {
                acutest_colorize_ = 0;
            } else if(strcmp(arg, "auto") == 0) {
                /*noop*/
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --color.\n", acutest_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
                acutest_exit_(2);
            }
            break;

        case 'C':
            acutest_colorize_ = 0;
            break;

        case 'h':
            acutest_help_();
            acutest_exit_(0);
            break;

        case 'w':
            acutest_worker_ = 1;
            acutest_worker_index_ = atoi(arg);
            break;
        case 'x':
            acutest_xml_output_ = fopen(arg, "w");
            if (!acutest_xml_output_) {
                fprintf(stderr, "Unable to open '%s': %s\n", arg, strerror(errno));
                acutest_exit_(2);
            }
            break;

        case 0:
            if(acutest_select_(arg) == 0) {
                fprintf(stderr, "%s: Unrecognized unit test '%s'\n", acutest_argv0_, arg);
                fprintf(stderr, "Try '%s --list' for list of unit tests.\n", acutest_argv0_);
                acutest_exit_(2);
            }
            break;

        case ACUTEST_CMDLINE_OPTID_UNKNOWN_:
            fprintf(stderr, "Unrecognized command line option '%s'.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
            acutest_exit_(2);
            break;

        case ACUTEST_CMDLINE_OPTID_MISSINGARG_:
            fprintf(stderr, "The command line option '%s' requires an argument.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
            acutest_exit_(2);
            break;

        case ACUTEST_CMDLINE_OPTID_BOGUSARG_:
            fprintf(stderr, "The command line option '%s' does not expect an argument.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
            acutest_exit_(2);
            break;
    }

    return 0;
}